

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sin.c
# Opt level: O1

double c_cos(double x)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double *coef;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  undefined8 local_28;
  
  iVar2 = isnan(x);
  if (iVar2 == 0) {
    iVar2 = isfinite(x);
    if (iVar2 == 0) {
      mtherr("cos",1);
      x = NAN;
    }
    else {
      uVar6 = (undefined4)((ulong)-x >> 0x20);
      if (-x <= x) {
        uVar6 = (undefined4)((ulong)x >> 0x20);
      }
      uVar5 = SUB84(x,0);
      if ((double)CONCAT44(uVar6,uVar5) < 1073741824.0 ||
          (double)CONCAT44(uVar6,uVar5) == 1073741824.0) {
        local_28 = (double)CONCAT44(uVar6,uVar5);
        dVar8 = floor((double)CONCAT44(uVar6,uVar5) / PIO4);
        dVar7 = ldexp(dVar8,-4);
        dVar7 = floor(dVar7);
        dVar7 = ldexp(dVar7,4);
        dVar7 = dVar8 - dVar7;
        uVar3 = (int)dVar7 & 1;
        if (uVar3 != 0) {
          dVar8 = dVar8 + 1.0;
        }
        uVar4 = uVar3 + (int)dVar7 & 7;
        uVar3 = uVar4 - 4;
        if (uVar4 < 4) {
          uVar3 = uVar4;
        }
        local_28 = dVar8 * -2.6951514290790595e-15 +
                   dVar8 * -3.774894707930798e-08 + local_28 + dVar8 * -0.7853981256484985;
        dVar8 = local_28 * local_28;
        if (uVar3 - 1 < 2) {
          coef = sincof;
          dVar7 = local_28;
        }
        else {
          local_28 = ldexp(dVar8,-1);
          local_28 = 1.0 - local_28;
          coef = coscof;
          dVar7 = dVar8;
        }
        dVar1 = polevl(dVar8,coef,5);
        x = dVar1 * dVar7 * dVar8 + local_28;
        if (3 < uVar4 != 1 < (int)uVar3) {
          x = -x;
        }
      }
      else {
        mtherr("cos",5);
        x = 0.0;
      }
    }
  }
  return x;
}

Assistant:

double c_cos(x)
double x;
{
double y, z, zz;
int i;
int j, sign;

#ifdef NANS
if( isnan(x) )
	return(x);
if( !isfinite(x) )
	{
	mtherr( "cos", DOMAIN );
	return(NAN);
	}
#endif

/* make argument positive */
sign = 1;
if( x < 0 )
	x = -x;

if( x > lossth )
	{
	mtherr( "cos", TLOSS );
	return(0.0);
	}

y = floor( x/PIO4 );
z = ldexp( y, -4 );
z = floor(z);		/* integer part of y/8 */
z = y - ldexp( z, 4 );  /* y - 16 * (y/16) */

/* integer and fractional part modulo one octant */
i = (int)z;
if( i & 1 )	/* map zeros to origin */
	{
	i += 1;
	y += 1.0;
	}
j = i & 07;
if( j > 3)
	{
	j -=4;
	sign = -sign;
	}

if( j > 1 )
	sign = -sign;

/* Extended precision modular arithmetic */
z = ((x - y * DP1) - y * DP2) - y * DP3;

zz = z * z;

if( (j==1) || (j==2) )
	{
/*	y = z  +  z * (zz * polevl( zz, sincof, 5 ));*/
	y = z  +  z * z * z * polevl( zz, sincof, 5 );
	}
else
	{
	y = 1.0 - ldexp(zz,-1) + zz * zz * polevl( zz, coscof, 5 );
	}

if(sign < 0)
	y = -y;

return(y);
}